

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_copy_tile_component_parameters(opj_j2k_v2_t *p_j2k)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  long in_RDI;
  OPJ_UINT32 l_prc_size;
  opj_tccp_t *l_copied_tccp;
  opj_tccp_t *l_ref_tccp;
  opj_tcp_v2_t *l_tcp;
  opj_cp_v2_t *l_cp;
  OPJ_UINT32 i;
  undefined8 local_40;
  undefined8 local_30;
  undefined4 local_c;
  
  if (*(int *)(in_RDI + 8) == 0x10) {
    local_40 = *(long *)(in_RDI + 0xd0) + (ulong)*(uint *)(in_RDI + 0x118) * 0x1630;
  }
  else {
    local_40 = *(long *)(in_RDI + 0x10);
  }
  lVar1 = *(long *)(local_40 + 0x15d0);
  uVar3 = *(int *)(lVar1 + 4) << 2;
  lVar2 = lVar1;
  for (local_c = 1; local_30 = lVar2 + 0x438, local_c < *(uint *)(*(long *)(in_RDI + 0x60) + 0x10);
      local_c = local_c + 1) {
    *(undefined4 *)(lVar2 + 0x43c) = *(undefined4 *)(lVar1 + 4);
    *(undefined4 *)(lVar2 + 0x440) = *(undefined4 *)(lVar1 + 8);
    *(undefined4 *)(lVar2 + 0x444) = *(undefined4 *)(lVar1 + 0xc);
    *(undefined4 *)(lVar2 + 0x448) = *(undefined4 *)(lVar1 + 0x10);
    *(undefined4 *)(lVar2 + 0x44c) = *(undefined4 *)(lVar1 + 0x14);
    memcpy((void *)(lVar2 + 0x764),(void *)(lVar1 + 0x32c),(ulong)uVar3);
    memcpy((void *)(lVar2 + 0x7e8),(void *)(lVar1 + 0x3b0),(ulong)uVar3);
    lVar2 = local_30;
  }
  return;
}

Assistant:

void j2k_copy_tile_component_parameters( opj_j2k_v2_t *p_j2k )
{
	/* loop */
	OPJ_UINT32 i;
	opj_cp_v2_t *l_cp = NULL;
	opj_tcp_v2_t *l_tcp = NULL;
	opj_tccp_t *l_ref_tccp = NULL, *l_copied_tccp = NULL;
	OPJ_UINT32 l_prc_size;

	/* preconditions */
	assert(p_j2k != 00);

	l_cp = &(p_j2k->m_cp);
	l_tcp = (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH) ? /* FIXME J2K_DEC_STATE_TPH*/
				&l_cp->tcps[p_j2k->m_current_tile_number] :
				p_j2k->m_specific_param.m_decoder.m_default_tcp;

	l_ref_tccp = &l_tcp->tccps[0];
	l_copied_tccp = l_ref_tccp + 1;
	l_prc_size = l_ref_tccp->numresolutions * sizeof(OPJ_UINT32);

	for	(i=1; i<p_j2k->m_private_image->numcomps; ++i) {
		l_copied_tccp->numresolutions = l_ref_tccp->numresolutions;
		l_copied_tccp->cblkw = l_ref_tccp->cblkw;
		l_copied_tccp->cblkh = l_ref_tccp->cblkh;
		l_copied_tccp->cblksty = l_ref_tccp->cblksty;
		l_copied_tccp->qmfbid = l_ref_tccp->qmfbid;
		memcpy(l_copied_tccp->prcw,l_ref_tccp->prcw,l_prc_size);
		memcpy(l_copied_tccp->prch,l_ref_tccp->prch,l_prc_size);
		++l_copied_tccp;
	}
}